

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  uint uVar1;
  size_t code;
  size_t sVar2;
  void *input;
  ulong uVar3;
  XXH64_hash_t XVar4;
  size_t in_RCX;
  U64 in_RDX;
  ZSTD_CCtx_params *in_RSI;
  size_t in_RDI;
  long in_stack_00000008;
  U32 checksum;
  size_t err_code_1;
  size_t err_code;
  size_t frameHeaderSize;
  size_t compressedBlocksSize;
  size_t cSize;
  BYTE *op;
  size_t in_stack_000001d8;
  ZSTD_EndDirective in_stack_000001e4;
  ZSTD_CCtx *in_stack_000001e8;
  U32 val32;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_fffffffffffffff8;
  
  if (in_RDI != 0) {
    code = ZSTD_CCtx_init_compressStream2(in_stack_000001e8,in_stack_000001e4,in_stack_000001d8);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      sVar2 = ZSTD_writeFrameHeader
                        (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,(U32)(in_RCX >> 0x20));
      input = (void *)(in_RDX - sVar2);
      if ((*(int *)(in_RDI + 0x104) != 0) && (in_stack_00000008 != 0)) {
        XXH_INLINE_XXH64_update((XXH_NAMESPACEXXH64_state_t *)in_RSI,input,in_RCX);
      }
      code = ZSTD_compressSequences_internal(cctx,dst,dstCapacity,inSeqs,inSeqsSize,src,srcSize);
      val32 = (U32)((ulong)in_stack_00000008 >> 0x20);
      uVar1 = ERR_isError(code);
      if (uVar1 == 0) {
        sVar2 = code + sVar2;
        uVar3 = (long)input - code;
        code = sVar2;
        if (*(int *)(in_RDI + 0x104) != 0) {
          XVar4 = XXH_INLINE_XXH64_digest
                            ((XXH_NAMESPACEXXH64_state_t *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          if (uVar3 < 4) {
            code = 0xffffffffffffffba;
          }
          else {
            MEM_writeLE32((void *)CONCAT44((int)XVar4,in_stack_ffffffffffffff90),val32);
            code = sVar2 + 4;
          }
        }
      }
    }
    return code;
  }
  __assert_fail("cctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6b4d,
                "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}